

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void PredictorSub0_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  long in_RCX;
  int in_EDX;
  long in_RDI;
  __m128i res;
  __m128i src;
  __m128i black;
  int i;
  int local_94;
  char cStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  char cStack_51;
  char cStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  char cStack_49;
  
  for (local_94 = 0; local_94 + 4 <= in_EDX; local_94 = local_94 + 4) {
    puVar3 = (undefined8 *)(in_RDI + (long)local_94 * 4);
    uVar1 = *puVar3;
    uVar2 = puVar3[1];
    cStack_55 = (char)((ulong)uVar1 >> 0x18);
    uStack_54 = (undefined1)((ulong)uVar1 >> 0x20);
    uStack_53 = (undefined1)((ulong)uVar1 >> 0x28);
    uStack_52 = (undefined1)((ulong)uVar1 >> 0x30);
    cStack_51 = (char)((ulong)uVar1 >> 0x38);
    cStack_4d = (char)((ulong)uVar2 >> 0x18);
    uStack_4c = (undefined1)((ulong)uVar2 >> 0x20);
    uStack_4b = (undefined1)((ulong)uVar2 >> 0x28);
    uStack_4a = (undefined1)((ulong)uVar2 >> 0x30);
    cStack_49 = (char)((ulong)uVar2 >> 0x38);
    puVar3 = (undefined8 *)(in_RCX + (long)local_94 * 4);
    *puVar3 = CONCAT17(cStack_51 + '\x01',
                       CONCAT16(uStack_52,
                                CONCAT15(uStack_53,
                                         CONCAT14(uStack_54,CONCAT13(cStack_55 + '\x01',(int3)uVar1)
                                                 ))));
    puVar3[1] = CONCAT17(cStack_49 + '\x01',
                         CONCAT16(uStack_4a,
                                  CONCAT15(uStack_4b,
                                           CONCAT14(uStack_4c,
                                                    CONCAT13(cStack_4d + '\x01',(int3)uVar2)))));
  }
  if (local_94 != in_EDX) {
    (*VP8LPredictorsSub_C[0])
              ((uint32_t *)(in_RDI + (long)local_94 * 4),(uint32_t *)0x0,in_EDX - local_94,
               (uint32_t *)(in_RCX + (long)local_94 * 4));
  }
  return;
}

Assistant:

static void PredictorSub0_SSE2(const uint32_t* in, const uint32_t* upper,
                               int num_pixels, uint32_t* out) {
  int i;
  const __m128i black = _mm_set1_epi32(ARGB_BLACK);
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i res = _mm_sub_epi8(src, black);
    _mm_storeu_si128((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[0](in + i, NULL, num_pixels - i, out + i);
  }
  (void)upper;
}